

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O0

void __thiscall MasterObjectHolder::clearApp(MasterObjectHolder *this,int index)

{
  bool bVar1;
  size_type sVar2;
  pointer pAVar3;
  int in_ESI;
  handle appList;
  guarded<std::deque<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>,_std::mutex>
  *in_stack_ffffffffffffff58;
  deque<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>
  *in_stack_ffffffffffffff60;
  lock_handle<std::deque<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>,_std::mutex>
  *this_00;
  int iVar4;
  undefined4 in_stack_ffffffffffffff84;
  undefined1 local_68 [32];
  undefined1 local_48 [32];
  lock_handle<std::deque<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>,_std::mutex>
  local_28;
  int local_c;
  
  local_c = in_ESI;
  gmlc::libguarded::
  guarded<std::deque<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>,_std::mutex>
  ::lock(in_stack_ffffffffffffff58);
  iVar4 = local_c;
  gmlc::libguarded::
  lock_handle<std::deque<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>,_std::mutex>
  ::operator->(&local_28);
  sVar2 = std::
          deque<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>
          ::size((deque<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>
                  *)0x1a4682);
  if ((iVar4 < (int)sVar2) && (-1 < local_c)) {
    gmlc::libguarded::
    lock_handle<std::deque<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>,_std::mutex>
    ::operator*(&local_28);
    std::
    deque<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>
    ::operator[](in_stack_ffffffffffffff60,(size_type)in_stack_ffffffffffffff58);
    pAVar3 = std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>::operator->
                       ((unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_> *)
                        0x1a46c4);
    pAVar3->valid = 0;
    gmlc::libguarded::
    lock_handle<std::deque<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>,_std::mutex>
    ::operator*(&local_28);
    std::
    deque<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>
    ::operator[](in_stack_ffffffffffffff60,(size_type)in_stack_ffffffffffffff58);
    std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>::operator=
              ((unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_> *)
               in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    gmlc::libguarded::
    lock_handle<std::deque<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>,_std::mutex>
    ::operator->(&local_28);
    sVar2 = std::
            deque<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>
            ::size((deque<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>
                    *)0x1a4709);
    if (10 < sVar2) {
      this_00 = &local_28;
      gmlc::libguarded::
      lock_handle<std::deque<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>,_std::mutex>
      ::operator->(this_00);
      std::
      deque<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>
      ::begin(&in_stack_ffffffffffffff58->m_obj);
      gmlc::libguarded::
      lock_handle<std::deque<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>,_std::mutex>
      ::operator->(this_00);
      std::
      deque<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>
      ::end(&in_stack_ffffffffffffff58->m_obj);
      bVar1 = std::
              none_of<std::_Deque_iterator<std::unique_ptr<helics::AppObject,std::default_delete<helics::AppObject>>,std::unique_ptr<helics::AppObject,std::default_delete<helics::AppObject>>&,std::unique_ptr<helics::AppObject,std::default_delete<helics::AppObject>>*>,MasterObjectHolder::clearApp(int)::__0>
                        (local_48,local_68);
      if (bVar1) {
        gmlc::libguarded::
        lock_handle<std::deque<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>,_std::mutex>
        ::operator->(&local_28);
        std::
        deque<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>
        ::clear((deque<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>
                 *)CONCAT44(in_stack_ffffffffffffff84,iVar4));
      }
    }
  }
  gmlc::libguarded::
  lock_handle<std::deque<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>,_std::mutex>
  ::~lock_handle((lock_handle<std::deque<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>,_std::mutex>
                  *)0x1a47b7);
  return;
}

Assistant:

void MasterObjectHolder::clearApp(int index)
{
    auto appList = apps.lock();
    if ((index < static_cast<int>(appList->size())) && (index >= 0)) {
        (*appList)[index]->valid = 0;
        (*appList)[index] = nullptr;
        if (appList->size() > 10) {
            if (std::none_of(appList->begin(), appList->end(), [](const auto& app) { return static_cast<bool>(app); })) {
                appList->clear();
            }
        }
    }
}